

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

bc_slist_t * bc_slist_append_list(bc_slist_t *l,bc_slist_t *n)

{
  _bc_slist_t *p_Var1;
  bc_slist_t *pbVar2;
  
  if (l == (bc_slist_t *)0x0) {
    return n;
  }
  p_Var1 = l;
  if (n != (bc_slist_t *)0x0) {
    do {
      pbVar2 = p_Var1;
      p_Var1 = pbVar2->next;
    } while (p_Var1 != (_bc_slist_t *)0x0);
    pbVar2->next = n;
  }
  return l;
}

Assistant:

bc_slist_t*
bc_slist_append_list(bc_slist_t *l, bc_slist_t *n)
{
    if (l == NULL) {
        return n;
    }
    if (n == NULL) {
        return l;
    }
    bc_slist_t *tmp;
    for (tmp = l; tmp->next != NULL; tmp = tmp->next);
    tmp->next = n;
    return l;
}